

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementHandle.cpp
# Opt level: O1

void __thiscall Rml::ElementHandleTargetData::SetDefiniteMargins(ElementHandleTargetData *this)

{
  anon_class_1_0_00000001 SetDefiniteMargin;
  anon_class_1_0_00000001 local_9;
  
  if (((this->computed->common).field_0x2 & 0x60) == 0) {
    SetDefiniteMargins::anon_class_1_0_00000001::operator()(&local_9,this->target,MarginTop,Top);
  }
  if (((this->computed->common).field_0x3 & 3) == 0) {
    SetDefiniteMargins::anon_class_1_0_00000001::operator()(&local_9,this->target,MarginRight,Right)
    ;
  }
  if (((this->computed->common).field_0x3 & 0xc) == 0) {
    SetDefiniteMargins::anon_class_1_0_00000001::operator()
              (&local_9,this->target,MarginBottom,Bottom);
  }
  if (((this->computed->common).field_0x3 & 0x30) == 0) {
    SetDefiniteMargins::anon_class_1_0_00000001::operator()(&local_9,this->target,MarginLeft,Left);
  }
  return;
}

Assistant:

void SetDefiniteMargins()
	{
		// Set any auto margins to their current value, since auto-margins may affect the size and position of an element.
		auto SetDefiniteMargin = [](Element* element, PropertyId margin_id, BoxEdge edge) {
			element->SetProperty(margin_id, Property(Math::Round(element->GetBox().GetEdge(BoxArea::Margin, edge)), Unit::PX));
		};
		using Style::Margin;
		if (computed.margin_top().type == Margin::Auto)
			SetDefiniteMargin(target, PropertyId::MarginTop, BoxEdge::Top);
		if (computed.margin_right().type == Margin::Auto)
			SetDefiniteMargin(target, PropertyId::MarginRight, BoxEdge::Right);
		if (computed.margin_bottom().type == Margin::Auto)
			SetDefiniteMargin(target, PropertyId::MarginBottom, BoxEdge::Bottom);
		if (computed.margin_left().type == Margin::Auto)
			SetDefiniteMargin(target, PropertyId::MarginLeft, BoxEdge::Left);
	}